

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::TenorTest_test_valid_near_far_tenor_validation_Test::TestBody
          (TenorTest_test_valid_near_far_tenor_validation_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28;
  
  local_38[0] = (internal)
                bidfx_public_api::Tenor::IsValidNearFarTenor
                          ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::TOMORROW);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x18,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38[0] = (internal)
                bidfx_public_api::Tenor::IsValidNearFarTenor
                          ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::IN_1_WEEK);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x19,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38[0] = (internal)
                bidfx_public_api::Tenor::IsValidNearFarTenor
                          ((Tenor *)&Tenor::SPOT,(Tenor *)&Tenor::IN_1_YEAR);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1a,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38[0] = (internal)
                bidfx_public_api::Tenor::IsValidNearFarTenor
                          ((Tenor *)&Tenor::IN_11_MONTHS,(Tenor *)&Tenor::IN_1_YEAR);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,
               (AssertionResult *)
               "Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1b,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(TenorTest, test_valid_near_far_tenor_validation)
{
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR));
}